

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

double __thiscall slang::SVInt::trunc(SVInt *this,double __x)

{
  bool bVar1;
  uint32_t uVar2;
  SVInt *this_00;
  uint in_EDX;
  SVInt *in_RSI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar3;
  uint32_t words;
  uint64_t mask;
  SVInt *result;
  undefined8 in_stack_ffffffffffffff48;
  undefined1 isSigned;
  SVInt *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  bitwidth_t in_stack_ffffffffffffff5c;
  SVInt *in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff6a;
  undefined1 in_stack_ffffffffffffff6b;
  bitwidth_t in_stack_ffffffffffffff6c;
  SVInt *in_stack_ffffffffffffff80;
  SVInt *src;
  uint32_t destOffset;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  
  isSigned = (undefined1)((ulong)in_stack_ffffffffffffff48 >> 0x38);
  src = this;
  bVar1 = isSingleWord(in_RSI);
  if (bVar1) {
    SVInt(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,(uint64_t)in_stack_ffffffffffffff50,
          (bool)isSigned);
    dVar3 = extraout_XMM0_Qa;
  }
  else {
    SVInt((SVInt *)0x2a1229);
    if ((in_EDX < 0x41) && (((in_RSI->super_SVIntStorage).unknownFlag & 1U) == 0)) {
      SVInt(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,(uint64_t)in_stack_ffffffffffffff50,
            (bool)isSigned);
      operator=((SVInt *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                in_stack_ffffffffffffff50);
      ~SVInt(in_stack_ffffffffffffff60);
    }
    else {
      allocZeroed(in_stack_ffffffffffffff6c,(bool)in_stack_ffffffffffffff6b,
                  (bool)in_stack_ffffffffffffff6a);
      operator=((SVInt *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                in_stack_ffffffffffffff50);
      ~SVInt(in_stack_ffffffffffffff60);
    }
    getRawData(in_stack_ffffffffffffff50);
    this_00 = (SVInt *)getRawData(in_stack_ffffffffffffff50);
    bitcpy((uint64_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
           (uint32_t)((ulong)in_RSI >> 0x20),(uint64_t *)src,(uint32_t)((ulong)this >> 0x20),
           (uint32_t)this);
    if (((in_RSI->super_SVIntStorage).unknownFlag & 1U) != 0) {
      uVar2 = getNumWords(in_EDX,false);
      destOffset = (uint32_t)((ulong)in_RSI >> 0x20);
      getRawData(in_stack_ffffffffffffff50);
      getNumWords((SVInt *)0x2a137c);
      bitcpy((uint64_t *)CONCAT44(uVar2,in_stack_ffffffffffffffa0),destOffset,(uint64_t *)src,
             (uint32_t)((ulong)this >> 0x20),(uint32_t)this);
    }
    clearUnusedBits(in_stack_ffffffffffffff80);
    checkUnknown(this_00);
    dVar3 = extraout_XMM0_Qa_00;
  }
  return dVar3;
}

Assistant:

SVInt SVInt::trunc(bitwidth_t bits) const {
    SLANG_ASSERT(bits > 0 && bits <= bitWidth);

    if (isSingleWord()) {
        uint64_t mask = bits == 64 ? UINT64_MAX : (1ull << bits) - 1;
        return SVInt(bits, val & mask, signFlag);
    }

    SVInt result;
    if (bits > 64 || unknownFlag)
        result = SVInt::allocZeroed(bits, signFlag, unknownFlag);
    else
        result = SVInt(bits, 0, signFlag);

    bitcpy(result.getRawData(), 0, getRawData(), bits, 0);

    if (unknownFlag) {
        // copy over preexisting unknown data
        uint32_t words = getNumWords(bits, false);
        bitcpy(result.getRawData() + words, 0, pVal + getNumWords() / 2, bits, 0);
    }

    result.clearUnusedBits();
    result.checkUnknown();
    return result;
}